

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

void edition_unittest::TestAllTypes::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint32_t uVar1;
  uint32_t uVar2;
  string_view value;
  string_view value_00;
  string_view value_01;
  string_view value_02;
  string_view value_03;
  anon_union_888_1_493b367e_for_TestAllTypes_11 *paVar3;
  TestAllTypes *pTVar4;
  TestAllTypes **v1;
  TestAllTypes **v2;
  char *failure_msg;
  LogMessage *pLVar5;
  RepeatedField<int> *pRVar6;
  RepeatedField<int> *pRVar7;
  RepeatedField<long> *pRVar8;
  RepeatedField<long> *pRVar9;
  RepeatedField<unsigned_int> *pRVar10;
  RepeatedField<unsigned_int> *pRVar11;
  RepeatedField<unsigned_long> *pRVar12;
  RepeatedField<unsigned_long> *pRVar13;
  RepeatedField<float> *this;
  RepeatedField<float> *other;
  RepeatedField<double> *this_00;
  RepeatedField<double> *other_00;
  RepeatedField<bool> *this_01;
  RepeatedField<bool> *other_01;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar14;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar15;
  RepeatedPtrField<edition_unittest::TestAllTypes_RepeatedGroup> *this_02;
  RepeatedPtrField<edition_unittest::TestAllTypes_RepeatedGroup> *other_02;
  RepeatedPtrField<edition_unittest::TestAllTypes_NestedMessage> *pRVar16;
  RepeatedPtrField<edition_unittest::TestAllTypes_NestedMessage> *pRVar17;
  RepeatedPtrField<edition_unittest::ForeignMessage> *this_03;
  RepeatedPtrField<edition_unittest::ForeignMessage> *other_03;
  RepeatedPtrField<proto2_unittest_import::ImportMessage> *this_04;
  RepeatedPtrField<proto2_unittest_import::ImportMessage> *other_04;
  uint32_t *puVar18;
  Arena *pAVar19;
  TestAllTypes_OptionalGroup *pTVar20;
  TestAllTypes_NestedMessage *pTVar21;
  ForeignMessage *pFVar22;
  ImportMessage *pIVar23;
  PublicImportMessage *pPVar24;
  Cord *value_04;
  string *psVar25;
  bool bVar26;
  string_view sVar27;
  bool oneof_needs_init;
  uint32_t oneof_to_case;
  uint32_t oneof_from_case;
  char *local_350;
  size_t local_348;
  char *local_340;
  size_t local_338;
  char *local_330;
  LogMessage local_320;
  Voidify local_30a;
  byte local_309;
  LogMessage local_308;
  Voidify local_2f2;
  byte local_2f1;
  LogMessage local_2f0;
  Voidify local_2da;
  byte local_2d9;
  LogMessage local_2d8;
  Voidify local_2c2;
  byte local_2c1;
  LogMessage local_2c0;
  Voidify local_2aa;
  byte local_2a9;
  LogMessage local_2a8;
  Voidify local_292;
  byte local_291;
  LogMessage local_290;
  Voidify local_279;
  string_view local_278;
  string_view local_268;
  string_view local_258;
  uint local_248;
  uint32_t cached_has_bits;
  LogMessage local_238;
  Voidify local_221;
  TestAllTypes *local_220;
  Nullable<const_char_*> local_218;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Arena *arena;
  TestAllTypes *from;
  TestAllTypes *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  Nullable<const_char_*> local_1e0;
  __pointer_type local_1d8;
  Nullable<const_char_*> local_1d0;
  __pointer_type local_1c8;
  Nullable<const_char_*> local_1c0;
  void *local_1b8;
  Nullable<const_char_*> local_1b0;
  ThreadSafeArena *local_1a8;
  Nullable<const_char_*> local_1a0;
  void *local_198;
  Nullable<const_char_*> local_190;
  __pointer_type local_188;
  Nullable<const_char_*> local_180;
  void *local_178;
  Nullable<const_char_*> local_170;
  void *local_168;
  Nullable<const_char_*> local_160;
  size_t local_158;
  char *local_150;
  TestAllTypes *local_148;
  size_t local_140;
  char *local_138;
  anon_union_888_1_493b367e_for_TestAllTypes_11 *local_130;
  size_t local_128;
  char *local_120;
  TestAllTypes *local_118;
  size_t local_110;
  char *local_108;
  anon_union_888_1_493b367e_for_TestAllTypes_11 *local_100;
  size_t local_f8;
  char *local_f0;
  TestAllTypes *local_e8;
  size_t local_e0;
  char *local_d8;
  anon_union_888_1_493b367e_for_TestAllTypes_11 *local_d0;
  string *local_c8;
  TestAllTypes *local_c0;
  anon_union_888_1_493b367e_for_TestAllTypes_11 *local_b8;
  size_t local_b0;
  char *local_a8;
  TestAllTypes *local_a0;
  size_t local_98;
  char *local_90;
  anon_union_888_1_493b367e_for_TestAllTypes_11 *local_88;
  size_t local_80;
  char *local_78;
  TestAllTypes *local_70;
  size_t local_68;
  char *local_60;
  anon_union_888_1_493b367e_for_TestAllTypes_11 *local_58;
  size_t local_50;
  char *local_48;
  TestAllTypes *local_40;
  size_t local_38;
  char *local_30;
  anon_union_888_1_493b367e_for_TestAllTypes_11 *local_28;
  string *local_20;
  TestAllTypes *local_18;
  anon_union_888_1_493b367e_for_TestAllTypes_11 *local_10;
  
  arena = (Arena *)from_msg;
  from = (TestAllTypes *)to_msg;
  _this = (TestAllTypes *)from_msg;
  from_msg_local = to_msg;
  absl_log_internal_check_op_result =
       (Nullable<const_char_*>)google::protobuf::MessageLite::GetArena(to_msg);
  local_220 = (TestAllTypes *)arena;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<edition_unittest::TestAllTypes_const*>(&local_220);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue<edition_unittest::TestAllTypes*>
                 (&from);
  local_218 = absl::lts_20250127::log_internal::
              Check_NEImpl<edition_unittest::TestAllTypes_const*,edition_unittest::TestAllTypes*>
                        (v1,v2,"&from != _this");
  if (local_218 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_218);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_238,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/edition_unittest.pb.cc"
               ,0x2886,failure_msg);
    pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_238);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_221,pLVar5);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_238);
  }
  local_248 = 0;
  pRVar6 = _internal_mutable_repeated_int32(from);
  pRVar7 = _internal_repeated_int32((TestAllTypes *)arena);
  google::protobuf::RepeatedField<int>::MergeFrom(pRVar6,pRVar7);
  pRVar8 = _internal_mutable_repeated_int64(from);
  pRVar9 = _internal_repeated_int64((TestAllTypes *)arena);
  google::protobuf::RepeatedField<long>::MergeFrom(pRVar8,pRVar9);
  pRVar10 = _internal_mutable_repeated_uint32(from);
  pRVar11 = _internal_repeated_uint32((TestAllTypes *)arena);
  google::protobuf::RepeatedField<unsigned_int>::MergeFrom(pRVar10,pRVar11);
  pRVar12 = _internal_mutable_repeated_uint64(from);
  pRVar13 = _internal_repeated_uint64((TestAllTypes *)arena);
  google::protobuf::RepeatedField<unsigned_long>::MergeFrom(pRVar12,pRVar13);
  pRVar6 = _internal_mutable_repeated_sint32(from);
  pRVar7 = _internal_repeated_sint32((TestAllTypes *)arena);
  google::protobuf::RepeatedField<int>::MergeFrom(pRVar6,pRVar7);
  pRVar8 = _internal_mutable_repeated_sint64(from);
  pRVar9 = _internal_repeated_sint64((TestAllTypes *)arena);
  google::protobuf::RepeatedField<long>::MergeFrom(pRVar8,pRVar9);
  pRVar10 = _internal_mutable_repeated_fixed32(from);
  pRVar11 = _internal_repeated_fixed32((TestAllTypes *)arena);
  google::protobuf::RepeatedField<unsigned_int>::MergeFrom(pRVar10,pRVar11);
  pRVar12 = _internal_mutable_repeated_fixed64(from);
  pRVar13 = _internal_repeated_fixed64((TestAllTypes *)arena);
  google::protobuf::RepeatedField<unsigned_long>::MergeFrom(pRVar12,pRVar13);
  pRVar6 = _internal_mutable_repeated_sfixed32(from);
  pRVar7 = _internal_repeated_sfixed32((TestAllTypes *)arena);
  google::protobuf::RepeatedField<int>::MergeFrom(pRVar6,pRVar7);
  pRVar8 = _internal_mutable_repeated_sfixed64(from);
  pRVar9 = _internal_repeated_sfixed64((TestAllTypes *)arena);
  google::protobuf::RepeatedField<long>::MergeFrom(pRVar8,pRVar9);
  this = _internal_mutable_repeated_float(from);
  other = _internal_repeated_float((TestAllTypes *)arena);
  google::protobuf::RepeatedField<float>::MergeFrom(this,other);
  this_00 = _internal_mutable_repeated_double(from);
  other_00 = _internal_repeated_double((TestAllTypes *)arena);
  google::protobuf::RepeatedField<double>::MergeFrom(this_00,other_00);
  this_01 = _internal_mutable_repeated_bool(from);
  other_01 = _internal_repeated_bool((TestAllTypes *)arena);
  google::protobuf::RepeatedField<bool>::MergeFrom(this_01,other_01);
  pRVar14 = _internal_mutable_repeated_string_abi_cxx11_(from);
  pRVar15 = _internal_repeated_string_abi_cxx11_((TestAllTypes *)arena);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom(pRVar14,pRVar15);
  pRVar14 = _internal_mutable_repeated_bytes_abi_cxx11_(from);
  pRVar15 = _internal_repeated_bytes_abi_cxx11_((TestAllTypes *)arena);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom(pRVar14,pRVar15);
  this_02 = _internal_mutable_repeatedgroup(from);
  other_02 = _internal_repeatedgroup((TestAllTypes *)arena);
  google::protobuf::RepeatedPtrField<edition_unittest::TestAllTypes_RepeatedGroup>::MergeFrom
            (this_02,other_02);
  pRVar16 = _internal_mutable_repeated_nested_message(from);
  pRVar17 = _internal_repeated_nested_message((TestAllTypes *)arena);
  google::protobuf::RepeatedPtrField<edition_unittest::TestAllTypes_NestedMessage>::MergeFrom
            (pRVar16,pRVar17);
  this_03 = _internal_mutable_repeated_foreign_message(from);
  other_03 = _internal_repeated_foreign_message((TestAllTypes *)arena);
  google::protobuf::RepeatedPtrField<edition_unittest::ForeignMessage>::MergeFrom(this_03,other_03);
  this_04 = _internal_mutable_repeated_import_message(from);
  other_04 = _internal_repeated_import_message((TestAllTypes *)arena);
  google::protobuf::RepeatedPtrField<proto2_unittest_import::ImportMessage>::MergeFrom
            (this_04,other_04);
  pRVar6 = _internal_mutable_repeated_nested_enum(from);
  pRVar7 = _internal_repeated_nested_enum((TestAllTypes *)arena);
  google::protobuf::RepeatedField<int>::MergeFrom(pRVar6,pRVar7);
  pRVar6 = _internal_mutable_repeated_foreign_enum(from);
  pRVar7 = _internal_repeated_foreign_enum((TestAllTypes *)arena);
  google::protobuf::RepeatedField<int>::MergeFrom(pRVar6,pRVar7);
  pRVar6 = _internal_mutable_repeated_import_enum(from);
  pRVar7 = _internal_repeated_import_enum((TestAllTypes *)arena);
  google::protobuf::RepeatedField<int>::MergeFrom(pRVar6,pRVar7);
  pRVar14 = _internal_mutable_repeated_string_piece_abi_cxx11_(from);
  pRVar15 = _internal_repeated_string_piece_abi_cxx11_((TestAllTypes *)arena);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom(pRVar14,pRVar15);
  pRVar14 = _internal_mutable_repeated_cord_abi_cxx11_(from);
  pRVar15 = _internal_repeated_cord_abi_cxx11_((TestAllTypes *)arena);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom(pRVar14,pRVar15);
  pRVar16 = _internal_mutable_repeated_lazy_message(from);
  pRVar17 = _internal_repeated_lazy_message((TestAllTypes *)arena);
  google::protobuf::RepeatedPtrField<edition_unittest::TestAllTypes_NestedMessage>::MergeFrom
            (pRVar16,pRVar17);
  puVar18 = google::protobuf::internal::HasBits<2>::operator[]
                      ((HasBits<2> *)&(arena->impl_).field_0x10,0);
  pTVar4 = from;
  local_248 = *puVar18;
  if ((local_248 & 0xff) != 0) {
    if ((local_248 & 1) != 0) {
      local_258 = _internal_optional_string((TestAllTypes *)arena);
      local_140 = local_258._M_len;
      local_138 = local_258._M_str;
      local_148 = pTVar4;
      local_130 = &pTVar4->field_0;
      puVar18 = google::protobuf::internal::HasBits<2>::operator[]
                          (&(pTVar4->field_0)._impl_._has_bits_,0);
      *puVar18 = *puVar18 | 1;
      local_158 = local_140;
      local_150 = local_138;
      pAVar19 = google::protobuf::MessageLite::GetArena((MessageLite *)pTVar4);
      sVar27._M_str = local_150;
      sVar27._M_len = local_158;
      google::protobuf::internal::ArenaStringPtr::Set
                (&(pTVar4->field_0)._impl_.optional_string_,sVar27,pAVar19);
    }
    pTVar4 = from;
    if ((local_248 & 2) != 0) {
      local_268 = _internal_optional_bytes((TestAllTypes *)arena);
      local_110 = local_268._M_len;
      local_108 = local_268._M_str;
      local_118 = pTVar4;
      local_100 = &pTVar4->field_0;
      puVar18 = google::protobuf::internal::HasBits<2>::operator[]
                          (&(pTVar4->field_0)._impl_._has_bits_,0);
      *puVar18 = *puVar18 | 2;
      local_128 = local_110;
      local_120 = local_108;
      pAVar19 = google::protobuf::MessageLite::GetArena((MessageLite *)pTVar4);
      value._M_str = local_120;
      value._M_len = local_128;
      google::protobuf::internal::ArenaStringPtr::Set
                (&(pTVar4->field_0)._impl_.optional_bytes_,value,pAVar19);
    }
    pTVar4 = from;
    if ((local_248 & 4) != 0) {
      local_278 = _internal_optional_string_piece((TestAllTypes *)arena);
      local_e0 = local_278._M_len;
      local_d8 = local_278._M_str;
      local_e8 = pTVar4;
      local_d0 = &pTVar4->field_0;
      puVar18 = google::protobuf::internal::HasBits<2>::operator[]
                          (&(pTVar4->field_0)._impl_._has_bits_,0);
      *puVar18 = *puVar18 | 4;
      local_f8 = local_e0;
      local_f0 = local_d8;
      pAVar19 = google::protobuf::MessageLite::GetArena((MessageLite *)pTVar4);
      value_00._M_str = local_f0;
      value_00._M_len = local_f8;
      google::protobuf::internal::ArenaStringPtr::Set
                (&(pTVar4->field_0)._impl_.optional_string_piece_,value_00,pAVar19);
    }
    pTVar4 = from;
    if ((local_248 & 8) != 0) {
      local_c8 = _internal_optional_cord_abi_cxx11_((TestAllTypes *)arena);
      local_c0 = pTVar4;
      local_b8 = &pTVar4->field_0;
      puVar18 = google::protobuf::internal::HasBits<2>::operator[]
                          (&(pTVar4->field_0)._impl_._has_bits_,0);
      psVar25 = local_c8;
      *puVar18 = *puVar18 | 8;
      pAVar19 = google::protobuf::MessageLite::GetArena((MessageLite *)pTVar4);
      google::protobuf::internal::ArenaStringPtr::Set<>
                (&(pTVar4->field_0)._impl_.optional_cord_,psVar25,pAVar19);
    }
    if ((local_248 & 0x10) != 0) {
      local_291 = 0;
      if (arena[3].impl_.first_arena_.string_block_._M_b._M_p == (__pointer_type)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_290,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/edition_unittest.pb.cc"
                   ,0x28b7,"from._impl_.optionalgroup_ != nullptr");
        local_291 = 1;
        pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_290);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_279,pLVar5);
      }
      if ((local_291 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_290);
      }
      if ((from->field_0)._impl_.optionalgroup_ == (TestAllTypes_OptionalGroup *)0x0) {
        to_msg_local = (MessageLite *)arena[3].impl_.first_arena_.string_block_._M_b._M_p;
        local_1e0 = absl_log_internal_check_op_result;
        pTVar20 = (TestAllTypes_OptionalGroup *)
                  google::protobuf::Arena::
                  CopyConstruct<edition_unittest::TestAllTypes_OptionalGroup>
                            ((Arena *)absl_log_internal_check_op_result,to_msg_local);
        (from->field_0)._impl_.optionalgroup_ = pTVar20;
      }
      else {
        TestAllTypes_OptionalGroup::MergeFrom
                  ((from->field_0)._impl_.optionalgroup_,
                   (TestAllTypes_OptionalGroup *)arena[3].impl_.first_arena_.string_block_._M_b._M_p
                  );
      }
    }
    if ((local_248 & 0x20) != 0) {
      local_2a9 = 0;
      if (arena[3].impl_.first_arena_.string_block_unused_.super___atomic_base<unsigned_long>._M_i
          == 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_2a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/edition_unittest.pb.cc"
                   ,0x28bf,"from._impl_.optional_nested_message_ != nullptr");
        local_2a9 = 1;
        pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_2a8);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_292,pLVar5);
      }
      if ((local_2a9 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_2a8);
      }
      if ((from->field_0)._impl_.optional_nested_message_ == (TestAllTypes_NestedMessage *)0x0) {
        local_198 = (void *)arena[3].impl_.first_arena_.string_block_unused_.
                            super___atomic_base<unsigned_long>._M_i;
        local_190 = absl_log_internal_check_op_result;
        pTVar21 = (TestAllTypes_NestedMessage *)
                  google::protobuf::Arena::
                  CopyConstruct<edition_unittest::TestAllTypes_NestedMessage>
                            ((Arena *)absl_log_internal_check_op_result,local_198);
        (from->field_0)._impl_.optional_nested_message_ = pTVar21;
      }
      else {
        edition_unittest::TestAllTypes_NestedMessage::MergeFrom
                  ((from->field_0)._impl_.optional_nested_message_,
                   (TestAllTypes_NestedMessage *)
                   arena[3].impl_.first_arena_.string_block_unused_.
                   super___atomic_base<unsigned_long>._M_i);
      }
    }
    if ((local_248 & 0x40) != 0) {
      local_2c1 = 0;
      if (arena[3].impl_.first_arena_.head_._M_b._M_p == (__pointer_type)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_2c0,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/edition_unittest.pb.cc"
                   ,0x28c7,"from._impl_.optional_foreign_message_ != nullptr");
        local_2c1 = 1;
        pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_2c0);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_2aa,pLVar5);
      }
      if ((local_2c1 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_2c0);
      }
      if ((from->field_0)._impl_.optional_foreign_message_ == (ForeignMessage *)0x0) {
        local_188 = arena[3].impl_.first_arena_.head_._M_b._M_p;
        local_180 = absl_log_internal_check_op_result;
        pFVar22 = (ForeignMessage *)
                  google::protobuf::Arena::CopyConstruct<edition_unittest::ForeignMessage>
                            ((Arena *)absl_log_internal_check_op_result,local_188);
        (from->field_0)._impl_.optional_foreign_message_ = pFVar22;
      }
      else {
        edition_unittest::ForeignMessage::MergeFrom
                  ((from->field_0)._impl_.optional_foreign_message_,
                   (ForeignMessage *)arena[3].impl_.first_arena_.head_._M_b._M_p);
      }
    }
    if ((local_248 & 0x80) != 0) {
      local_2d9 = 0;
      if (arena[3].impl_.first_arena_.space_used_.super___atomic_base<unsigned_long>._M_i == 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_2d8,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/edition_unittest.pb.cc"
                   ,0x28cf,"from._impl_.optional_import_message_ != nullptr");
        local_2d9 = 1;
        pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_2d8);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_2c2,pLVar5);
      }
      if ((local_2d9 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_2d8);
      }
      if ((from->field_0)._impl_.optional_import_message_ == (ImportMessage *)0x0) {
        local_178 = (void *)arena[3].impl_.first_arena_.space_used_.
                            super___atomic_base<unsigned_long>._M_i;
        local_170 = absl_log_internal_check_op_result;
        pIVar23 = (ImportMessage *)
                  google::protobuf::Arena::CopyConstruct<proto2_unittest_import::ImportMessage>
                            ((Arena *)absl_log_internal_check_op_result,local_178);
        (from->field_0)._impl_.optional_import_message_ = pIVar23;
      }
      else {
        proto2_unittest_import::ImportMessage::MergeFrom
                  ((from->field_0)._impl_.optional_import_message_,
                   (ImportMessage *)
                   arena[3].impl_.first_arena_.space_used_.super___atomic_base<unsigned_long>._M_i);
      }
    }
  }
  if ((local_248 & 0xff00) != 0) {
    if ((local_248 & 0x100) != 0) {
      local_2f1 = 0;
      if (arena[3].impl_.first_arena_.space_allocated_.super___atomic_base<unsigned_long>._M_i == 0)
      {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_2f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/edition_unittest.pb.cc"
                   ,0x28d9,"from._impl_.optional_public_import_message_ != nullptr");
        local_2f1 = 1;
        pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_2f0);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_2da,pLVar5);
      }
      if ((local_2f1 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_2f0);
      }
      if ((from->field_0)._impl_.optional_public_import_message_ == (PublicImportMessage *)0x0) {
        local_168 = (void *)arena[3].impl_.first_arena_.space_allocated_.
                            super___atomic_base<unsigned_long>._M_i;
        local_160 = absl_log_internal_check_op_result;
        pPVar24 = (PublicImportMessage *)
                  google::protobuf::Arena::
                  CopyConstruct<proto2_unittest_import::PublicImportMessage>
                            ((Arena *)absl_log_internal_check_op_result,local_168);
        (from->field_0)._impl_.optional_public_import_message_ = pPVar24;
      }
      else {
        proto2_unittest_import::PublicImportMessage::MergeFrom
                  ((from->field_0)._impl_.optional_public_import_message_,
                   (PublicImportMessage *)
                   arena[3].impl_.first_arena_.space_allocated_.super___atomic_base<unsigned_long>.
                   _M_i);
      }
    }
    if ((local_248 & 0x200) != 0) {
      local_309 = 0;
      if (arena[3].impl_.first_arena_.parent_ == (ThreadSafeArena *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_308,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/edition_unittest.pb.cc"
                   ,0x28e1,"from._impl_.optional_lazy_message_ != nullptr");
        local_309 = 1;
        pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_308);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_2f2,pLVar5);
      }
      if ((local_309 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_308);
      }
      if ((from->field_0)._impl_.optional_lazy_message_ == (TestAllTypes_NestedMessage *)0x0) {
        local_1a8 = arena[3].impl_.first_arena_.parent_;
        local_1a0 = absl_log_internal_check_op_result;
        pTVar21 = (TestAllTypes_NestedMessage *)
                  google::protobuf::Arena::
                  CopyConstruct<edition_unittest::TestAllTypes_NestedMessage>
                            ((Arena *)absl_log_internal_check_op_result,local_1a8);
        (from->field_0)._impl_.optional_lazy_message_ = pTVar21;
      }
      else {
        edition_unittest::TestAllTypes_NestedMessage::MergeFrom
                  ((from->field_0)._impl_.optional_lazy_message_,
                   (TestAllTypes_NestedMessage *)arena[3].impl_.first_arena_.parent_);
      }
    }
    if ((local_248 & 0x400) != 0) {
      if (*(long *)&arena[3].impl_.first_arena_.cached_block_length_ == 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_320,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/edition_unittest.pb.cc"
                   ,0x28e9,"from._impl_.optional_unverified_lazy_message_ != nullptr");
        pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_320);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_30a,pLVar5);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_320);
      }
      if ((from->field_0)._impl_.optional_unverified_lazy_message_ ==
          (TestAllTypes_NestedMessage *)0x0) {
        local_1b8 = *(void **)&arena[3].impl_.first_arena_.cached_block_length_;
        local_1b0 = absl_log_internal_check_op_result;
        pTVar21 = (TestAllTypes_NestedMessage *)
                  google::protobuf::Arena::
                  CopyConstruct<edition_unittest::TestAllTypes_NestedMessage>
                            ((Arena *)absl_log_internal_check_op_result,local_1b8);
        (from->field_0)._impl_.optional_unverified_lazy_message_ = pTVar21;
      }
      else {
        edition_unittest::TestAllTypes_NestedMessage::MergeFrom
                  ((from->field_0)._impl_.optional_unverified_lazy_message_,
                   *(TestAllTypes_NestedMessage **)&arena[3].impl_.first_arena_.cached_block_length_
                  );
      }
    }
    if ((local_248 & 0x800) != 0) {
      (from->field_0)._impl_.optional_int64_ = (int64_t)arena[3].impl_.first_arena_.cached_blocks_;
    }
    if ((local_248 & 0x1000) != 0) {
      (from->field_0)._impl_.optional_int32_ = (int32_t)arena[4].impl_.tag_and_id_;
    }
    if ((local_248 & 0x2000) != 0) {
      (from->field_0)._impl_.optional_uint32_ = *(uint32_t *)((long)&arena[4].impl_.tag_and_id_ + 4)
      ;
    }
    if ((local_248 & 0x4000) != 0) {
      (from->field_0)._impl_.optional_uint64_ = arena[4].impl_.alloc_policy_.policy_;
    }
    if ((local_248 & 0x8000) != 0) {
      (from->field_0)._impl_.optional_sint64_ = *(int64_t *)&arena[4].impl_.field_0x10;
    }
  }
  pTVar4 = from;
  if ((local_248 & 0xff0000) != 0) {
    if ((local_248 & 0x10000) != 0) {
      (from->field_0)._impl_.optional_sint32_ =
           (int32_t)arena[4].impl_.mutex_.mu_.super___atomic_base<long>._M_i;
    }
    if ((local_248 & 0x20000) != 0) {
      (from->field_0)._impl_.optional_fixed32_ =
           *(uint32_t *)((long)&arena[4].impl_.mutex_.mu_.super___atomic_base<long>._M_i + 4);
    }
    if ((local_248 & 0x40000) != 0) {
      *(__pointer_type *)((long)&from->field_0 + 0x2b0) = arena[4].impl_.head_._M_b._M_p;
    }
    if ((local_248 & 0x80000) != 0) {
      (from->field_0)._impl_.optional_sfixed64_ = (int64_t)arena[4].impl_.first_owner_;
    }
    if ((local_248 & 0x100000) != 0) {
      (from->field_0)._impl_.optional_sfixed32_ =
           *(int32_t *)&arena[4].impl_.first_arena_.ptr_._M_b._M_p;
    }
    if ((local_248 & 0x200000) != 0) {
      (from->field_0)._impl_.optional_float_ =
           *(float *)((long)&arena[4].impl_.first_arena_.ptr_._M_b._M_p + 4);
    }
    if ((local_248 & 0x400000) != 0) {
      (from->field_0)._impl_.optional_double_ = (double)arena[4].impl_.first_arena_.limit_;
    }
    if ((local_248 & 0x800000) != 0) {
      (from->field_0)._impl_.optional_bool_ =
           (bool)(*(byte *)&arena[4].impl_.first_arena_.prefetch_ptr_ & 1);
    }
  }
  if ((local_248 & 0xff000000) != 0) {
    if ((local_248 & 0x1000000) != 0) {
      (from->field_0)._impl_.optional_import_enum_ =
           *(int *)((long)&arena[4].impl_.first_arena_.prefetch_ptr_ + 4);
    }
    if ((local_248 & 0x2000000) != 0) {
      (from->field_0)._impl_.optional_nested_enum_ =
           *(int *)&arena[4].impl_.first_arena_.cleanup_list_.head_;
    }
    if ((local_248 & 0x4000000) != 0) {
      (from->field_0)._impl_.optional_foreign_enum_ =
           *(int *)((long)&arena[4].impl_.first_arena_.cleanup_list_.head_ + 4);
    }
    if ((local_248 & 0x8000000) != 0) {
      sVar27 = _internal_default_string((TestAllTypes *)arena);
      local_338 = sVar27._M_len;
      local_330 = sVar27._M_str;
      local_98 = local_338;
      local_90 = local_330;
      local_a0 = pTVar4;
      local_88 = &pTVar4->field_0;
      puVar18 = google::protobuf::internal::HasBits<2>::operator[]
                          (&(pTVar4->field_0)._impl_._has_bits_,0);
      *puVar18 = *puVar18 | 0x8000000;
      local_b0 = local_98;
      local_a8 = local_90;
      pAVar19 = google::protobuf::MessageLite::GetArena((MessageLite *)pTVar4);
      value_01._M_str = local_a8;
      value_01._M_len = local_b0;
      google::protobuf::internal::ArenaStringPtr::Set
                (&(pTVar4->field_0)._impl_.default_string_,value_01,pAVar19);
    }
    pTVar4 = from;
    if ((local_248 & 0x10000000) != 0) {
      sVar27 = _internal_default_bytes((TestAllTypes *)arena);
      local_348 = sVar27._M_len;
      local_340 = sVar27._M_str;
      local_68 = local_348;
      local_60 = local_340;
      local_70 = pTVar4;
      local_58 = &pTVar4->field_0;
      puVar18 = google::protobuf::internal::HasBits<2>::operator[]
                          (&(pTVar4->field_0)._impl_._has_bits_,0);
      *puVar18 = *puVar18 | 0x10000000;
      local_80 = local_68;
      local_78 = local_60;
      pAVar19 = google::protobuf::MessageLite::GetArena((MessageLite *)pTVar4);
      value_02._M_str = local_78;
      value_02._M_len = local_80;
      google::protobuf::internal::ArenaStringPtr::Set
                (&(pTVar4->field_0)._impl_.default_bytes_,value_02,pAVar19);
    }
    pTVar4 = from;
    if ((local_248 & 0x20000000) != 0) {
      sVar27 = _internal_default_string_piece((TestAllTypes *)arena);
      _oneof_to_case = sVar27._M_len;
      local_350 = sVar27._M_str;
      local_38 = _oneof_to_case;
      local_30 = local_350;
      local_40 = pTVar4;
      local_28 = &pTVar4->field_0;
      puVar18 = google::protobuf::internal::HasBits<2>::operator[]
                          (&(pTVar4->field_0)._impl_._has_bits_,0);
      *puVar18 = *puVar18 | 0x20000000;
      local_50 = local_38;
      local_48 = local_30;
      pAVar19 = google::protobuf::MessageLite::GetArena((MessageLite *)pTVar4);
      value_03._M_str = local_48;
      value_03._M_len = local_50;
      google::protobuf::internal::ArenaStringPtr::Set
                (&(pTVar4->field_0)._impl_.default_string_piece_,value_03,pAVar19);
    }
    pTVar4 = from;
    if ((local_248 & 0x40000000) != 0) {
      local_20 = _internal_default_cord_abi_cxx11_((TestAllTypes *)arena);
      local_18 = pTVar4;
      local_10 = &pTVar4->field_0;
      puVar18 = google::protobuf::internal::HasBits<2>::operator[]
                          (&(pTVar4->field_0)._impl_._has_bits_,0);
      psVar25 = local_20;
      *puVar18 = *puVar18 | 0x40000000;
      pAVar19 = google::protobuf::MessageLite::GetArena((MessageLite *)pTVar4);
      google::protobuf::internal::ArenaStringPtr::Set<>
                (&(pTVar4->field_0)._impl_.default_cord_,psVar25,pAVar19);
    }
    pTVar4 = from;
    if ((local_248 & 0x80000000) != 0) {
      value_04 = _internal_optional_bytes_cord((TestAllTypes *)arena);
      _internal_set_optional_bytes_cord(pTVar4,value_04);
    }
  }
  puVar18 = google::protobuf::internal::HasBits<2>::operator[]
                      ((HasBits<2> *)&(arena->impl_).field_0x10,1);
  local_248 = *puVar18;
  if ((local_248 & 0xff) != 0) {
    if ((local_248 & 1) != 0) {
      *(__int_type_conflict2 *)((long)&from->field_0 + 0x310) =
           arena[4].impl_.first_arena_.space_used_.super___atomic_base<unsigned_long>._M_i;
    }
    if ((local_248 & 2) != 0) {
      (from->field_0)._impl_.default_int32_ =
           (int32_t)arena[4].impl_.first_arena_.space_allocated_.super___atomic_base<unsigned_long>.
                    _M_i;
    }
    if ((local_248 & 4) != 0) {
      (from->field_0)._impl_.default_uint32_ =
           *(uint32_t *)
            ((long)&arena[4].impl_.first_arena_.space_allocated_.super___atomic_base<unsigned_long>.
                    _M_i + 4);
    }
    if ((local_248 & 8) != 0) {
      (from->field_0)._impl_.default_uint64_ = (uint64_t)arena[4].impl_.first_arena_.parent_;
    }
    if ((local_248 & 0x10) != 0) {
      (from->field_0)._impl_.default_sint64_ =
           *(int64_t *)&arena[4].impl_.first_arena_.cached_block_length_;
    }
    if ((local_248 & 0x20) != 0) {
      (from->field_0)._impl_.default_sint32_ =
           *(int32_t *)&arena[4].impl_.first_arena_.cached_blocks_;
    }
    if ((local_248 & 0x40) != 0) {
      (from->field_0)._impl_.default_fixed32_ =
           *(uint32_t *)((long)&arena[4].impl_.first_arena_.cached_blocks_ + 4);
    }
    if ((local_248 & 0x80) != 0) {
      (from->field_0)._impl_.default_fixed64_ = arena[5].impl_.tag_and_id_;
    }
  }
  if ((local_248 & 0xff00) != 0) {
    if ((local_248 & 0x100) != 0) {
      (from->field_0)._impl_.default_sfixed64_ = arena[5].impl_.alloc_policy_.policy_;
    }
    if ((local_248 & 0x200) != 0) {
      (from->field_0)._impl_.default_sfixed32_ = *(int32_t *)&arena[5].impl_.field_0x10;
    }
    if ((local_248 & 0x400) != 0) {
      (from->field_0)._impl_.default_float_ = *(float *)&arena[5].impl_.field_0x14;
    }
    if ((local_248 & 0x800) != 0) {
      *(__int_type_conflict *)((long)&from->field_0 + 0x350) =
           arena[5].impl_.mutex_.mu_.super___atomic_base<long>._M_i;
    }
    if ((local_248 & 0x1000) != 0) {
      (from->field_0)._impl_.default_bool_ = (bool)(*(byte *)&arena[5].impl_.head_._M_b._M_p & 1);
    }
    if ((local_248 & 0x2000) != 0) {
      (from->field_0)._impl_.default_nested_enum_ =
           *(int *)((long)&arena[5].impl_.head_._M_b._M_p + 4);
    }
    if ((local_248 & 0x4000) != 0) {
      (from->field_0)._impl_.default_foreign_enum_ = *(int *)&arena[5].impl_.first_owner_;
    }
    if ((local_248 & 0x8000) != 0) {
      (from->field_0)._impl_.default_import_enum_ = *(int *)((long)&arena[5].impl_.first_owner_ + 4)
      ;
    }
  }
  google::protobuf::internal::HasBits<2>::Or
            (&(from->field_0)._impl_._has_bits_,(HasBits<2> *)&(arena->impl_).field_0x10);
  uVar1 = *(uint32_t *)&arena[5].impl_.first_arena_.limit_;
  if (uVar1 != 0) {
    uVar2 = (from->field_0)._impl_._oneof_case_[0];
    bVar26 = uVar2 != uVar1;
    if (bVar26) {
      if (uVar2 != 0) {
        clear_oneof_field(from);
      }
      (from->field_0)._impl_._oneof_case_[0] = uVar1;
    }
    if (uVar1 != 0) {
      if (uVar1 == 0x6f) {
        *(undefined4 *)((long)&from->field_0 + 0x368) =
             *(undefined4 *)&arena[5].impl_.first_arena_.ptr_._M_b._M_p;
      }
      else if (uVar1 == 0x70) {
        if (bVar26) {
          local_1c8 = arena[5].impl_.first_arena_.ptr_._M_b._M_p;
          local_1c0 = absl_log_internal_check_op_result;
          pTVar21 = (TestAllTypes_NestedMessage *)
                    google::protobuf::Arena::
                    CopyConstruct<edition_unittest::TestAllTypes_NestedMessage>
                              ((Arena *)absl_log_internal_check_op_result,local_1c8);
          (from->field_0)._impl_.oneof_field_.oneof_nested_message_ = pTVar21;
        }
        else {
          edition_unittest::TestAllTypes_NestedMessage::MergeFrom
                    ((from->field_0)._impl_.oneof_field_.oneof_nested_message_,
                     (TestAllTypes_NestedMessage *)arena[5].impl_.first_arena_.ptr_._M_b._M_p);
        }
      }
      else if (uVar1 == 0x71) {
        if (bVar26) {
          google::protobuf::internal::ArenaStringPtr::InitDefault
                    (&(from->field_0)._impl_.oneof_field_.oneof_string_);
        }
        paVar3 = &from->field_0;
        sVar27 = _internal_oneof_string((TestAllTypes *)arena);
        google::protobuf::internal::ArenaStringPtr::Set
                  (&(paVar3->_impl_).oneof_field_.oneof_string_,sVar27,
                   (Arena *)absl_log_internal_check_op_result);
      }
      else if (uVar1 == 0x72) {
        if (bVar26) {
          google::protobuf::internal::ArenaStringPtr::InitDefault
                    (&(from->field_0)._impl_.oneof_field_.oneof_string_);
        }
        paVar3 = &from->field_0;
        sVar27 = _internal_oneof_bytes((TestAllTypes *)arena);
        google::protobuf::internal::ArenaStringPtr::Set
                  (&(paVar3->_impl_).oneof_field_.oneof_string_,sVar27,
                   (Arena *)absl_log_internal_check_op_result);
      }
      else if (uVar1 == 0x73) {
        if (bVar26) {
          google::protobuf::internal::ArenaStringPtr::InitDefault
                    (&(from->field_0)._impl_.oneof_field_.oneof_string_);
        }
        paVar3 = &from->field_0;
        psVar25 = _internal_oneof_cord_abi_cxx11_((TestAllTypes *)arena);
        google::protobuf::internal::ArenaStringPtr::Set<>
                  (&(paVar3->_impl_).oneof_field_.oneof_string_,psVar25,
                   (Arena *)absl_log_internal_check_op_result);
      }
      else if (uVar1 == 0x74) {
        if (bVar26) {
          google::protobuf::internal::ArenaStringPtr::InitDefault
                    (&(from->field_0)._impl_.oneof_field_.oneof_string_);
        }
        paVar3 = &from->field_0;
        sVar27 = _internal_oneof_string_piece((TestAllTypes *)arena);
        google::protobuf::internal::ArenaStringPtr::Set
                  (&(paVar3->_impl_).oneof_field_.oneof_string_,sVar27,
                   (Arena *)absl_log_internal_check_op_result);
      }
      else if (uVar1 == 0x75) {
        if (bVar26) {
          local_1d8 = arena[5].impl_.first_arena_.ptr_._M_b._M_p;
          local_1d0 = absl_log_internal_check_op_result;
          pTVar21 = (TestAllTypes_NestedMessage *)
                    google::protobuf::Arena::
                    CopyConstruct<edition_unittest::TestAllTypes_NestedMessage>
                              ((Arena *)absl_log_internal_check_op_result,local_1d8);
          (from->field_0)._impl_.oneof_field_.oneof_nested_message_ = pTVar21;
        }
        else {
          edition_unittest::TestAllTypes_NestedMessage::MergeFrom
                    ((from->field_0)._impl_.oneof_field_.oneof_nested_message_,
                     (TestAllTypes_NestedMessage *)arena[5].impl_.first_arena_.ptr_._M_b._M_p);
        }
      }
    }
  }
  google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(from->super_Message).super_MessageLite._internal_metadata_,
             (InternalMetadata *)&(arena->impl_).alloc_policy_);
  return;
}

Assistant:

void TestAllTypes::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestAllTypes*>(&to_msg);
  auto& from = static_cast<const TestAllTypes&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:edition_unittest.TestAllTypes)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_repeated_int32()->MergeFrom(from._internal_repeated_int32());
  _this->_internal_mutable_repeated_int64()->MergeFrom(from._internal_repeated_int64());
  _this->_internal_mutable_repeated_uint32()->MergeFrom(from._internal_repeated_uint32());
  _this->_internal_mutable_repeated_uint64()->MergeFrom(from._internal_repeated_uint64());
  _this->_internal_mutable_repeated_sint32()->MergeFrom(from._internal_repeated_sint32());
  _this->_internal_mutable_repeated_sint64()->MergeFrom(from._internal_repeated_sint64());
  _this->_internal_mutable_repeated_fixed32()->MergeFrom(from._internal_repeated_fixed32());
  _this->_internal_mutable_repeated_fixed64()->MergeFrom(from._internal_repeated_fixed64());
  _this->_internal_mutable_repeated_sfixed32()->MergeFrom(from._internal_repeated_sfixed32());
  _this->_internal_mutable_repeated_sfixed64()->MergeFrom(from._internal_repeated_sfixed64());
  _this->_internal_mutable_repeated_float()->MergeFrom(from._internal_repeated_float());
  _this->_internal_mutable_repeated_double()->MergeFrom(from._internal_repeated_double());
  _this->_internal_mutable_repeated_bool()->MergeFrom(from._internal_repeated_bool());
  _this->_internal_mutable_repeated_string()->MergeFrom(from._internal_repeated_string());
  _this->_internal_mutable_repeated_bytes()->MergeFrom(from._internal_repeated_bytes());
  _this->_internal_mutable_repeatedgroup()->MergeFrom(
      from._internal_repeatedgroup());
  _this->_internal_mutable_repeated_nested_message()->MergeFrom(
      from._internal_repeated_nested_message());
  _this->_internal_mutable_repeated_foreign_message()->MergeFrom(
      from._internal_repeated_foreign_message());
  _this->_internal_mutable_repeated_import_message()->MergeFrom(
      from._internal_repeated_import_message());
  _this->_internal_mutable_repeated_nested_enum()->MergeFrom(from._internal_repeated_nested_enum());
  _this->_internal_mutable_repeated_foreign_enum()->MergeFrom(from._internal_repeated_foreign_enum());
  _this->_internal_mutable_repeated_import_enum()->MergeFrom(from._internal_repeated_import_enum());
  _this->_internal_mutable_repeated_string_piece()->MergeFrom(from._internal_repeated_string_piece());
  _this->_internal_mutable_repeated_cord()->MergeFrom(from._internal_repeated_cord());
  _this->_internal_mutable_repeated_lazy_message()->MergeFrom(
      from._internal_repeated_lazy_message());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_optional_string(from._internal_optional_string());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_internal_set_optional_bytes(from._internal_optional_bytes());
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_internal_set_optional_string_piece(from._internal_optional_string_piece());
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _this->_internal_set_optional_cord(from._internal_optional_cord());
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      ABSL_DCHECK(from._impl_.optionalgroup_ != nullptr);
      if (_this->_impl_.optionalgroup_ == nullptr) {
        _this->_impl_.optionalgroup_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.optionalgroup_);
      } else {
        _this->_impl_.optionalgroup_->MergeFrom(*from._impl_.optionalgroup_);
      }
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      ABSL_DCHECK(from._impl_.optional_nested_message_ != nullptr);
      if (_this->_impl_.optional_nested_message_ == nullptr) {
        _this->_impl_.optional_nested_message_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.optional_nested_message_);
      } else {
        _this->_impl_.optional_nested_message_->MergeFrom(*from._impl_.optional_nested_message_);
      }
    }
    if ((cached_has_bits & 0x00000040u) != 0) {
      ABSL_DCHECK(from._impl_.optional_foreign_message_ != nullptr);
      if (_this->_impl_.optional_foreign_message_ == nullptr) {
        _this->_impl_.optional_foreign_message_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.optional_foreign_message_);
      } else {
        _this->_impl_.optional_foreign_message_->MergeFrom(*from._impl_.optional_foreign_message_);
      }
    }
    if ((cached_has_bits & 0x00000080u) != 0) {
      ABSL_DCHECK(from._impl_.optional_import_message_ != nullptr);
      if (_this->_impl_.optional_import_message_ == nullptr) {
        _this->_impl_.optional_import_message_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.optional_import_message_);
      } else {
        _this->_impl_.optional_import_message_->MergeFrom(*from._impl_.optional_import_message_);
      }
    }
  }
  if ((cached_has_bits & 0x0000ff00u) != 0) {
    if ((cached_has_bits & 0x00000100u) != 0) {
      ABSL_DCHECK(from._impl_.optional_public_import_message_ != nullptr);
      if (_this->_impl_.optional_public_import_message_ == nullptr) {
        _this->_impl_.optional_public_import_message_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.optional_public_import_message_);
      } else {
        _this->_impl_.optional_public_import_message_->MergeFrom(*from._impl_.optional_public_import_message_);
      }
    }
    if ((cached_has_bits & 0x00000200u) != 0) {
      ABSL_DCHECK(from._impl_.optional_lazy_message_ != nullptr);
      if (_this->_impl_.optional_lazy_message_ == nullptr) {
        _this->_impl_.optional_lazy_message_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.optional_lazy_message_);
      } else {
        _this->_impl_.optional_lazy_message_->MergeFrom(*from._impl_.optional_lazy_message_);
      }
    }
    if ((cached_has_bits & 0x00000400u) != 0) {
      ABSL_DCHECK(from._impl_.optional_unverified_lazy_message_ != nullptr);
      if (_this->_impl_.optional_unverified_lazy_message_ == nullptr) {
        _this->_impl_.optional_unverified_lazy_message_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.optional_unverified_lazy_message_);
      } else {
        _this->_impl_.optional_unverified_lazy_message_->MergeFrom(*from._impl_.optional_unverified_lazy_message_);
      }
    }
    if ((cached_has_bits & 0x00000800u) != 0) {
      _this->_impl_.optional_int64_ = from._impl_.optional_int64_;
    }
    if ((cached_has_bits & 0x00001000u) != 0) {
      _this->_impl_.optional_int32_ = from._impl_.optional_int32_;
    }
    if ((cached_has_bits & 0x00002000u) != 0) {
      _this->_impl_.optional_uint32_ = from._impl_.optional_uint32_;
    }
    if ((cached_has_bits & 0x00004000u) != 0) {
      _this->_impl_.optional_uint64_ = from._impl_.optional_uint64_;
    }
    if ((cached_has_bits & 0x00008000u) != 0) {
      _this->_impl_.optional_sint64_ = from._impl_.optional_sint64_;
    }
  }
  if ((cached_has_bits & 0x00ff0000u) != 0) {
    if ((cached_has_bits & 0x00010000u) != 0) {
      _this->_impl_.optional_sint32_ = from._impl_.optional_sint32_;
    }
    if ((cached_has_bits & 0x00020000u) != 0) {
      _this->_impl_.optional_fixed32_ = from._impl_.optional_fixed32_;
    }
    if ((cached_has_bits & 0x00040000u) != 0) {
      _this->_impl_.optional_fixed64_ = from._impl_.optional_fixed64_;
    }
    if ((cached_has_bits & 0x00080000u) != 0) {
      _this->_impl_.optional_sfixed64_ = from._impl_.optional_sfixed64_;
    }
    if ((cached_has_bits & 0x00100000u) != 0) {
      _this->_impl_.optional_sfixed32_ = from._impl_.optional_sfixed32_;
    }
    if ((cached_has_bits & 0x00200000u) != 0) {
      _this->_impl_.optional_float_ = from._impl_.optional_float_;
    }
    if ((cached_has_bits & 0x00400000u) != 0) {
      _this->_impl_.optional_double_ = from._impl_.optional_double_;
    }
    if ((cached_has_bits & 0x00800000u) != 0) {
      _this->_impl_.optional_bool_ = from._impl_.optional_bool_;
    }
  }
  if ((cached_has_bits & 0xff000000u) != 0) {
    if ((cached_has_bits & 0x01000000u) != 0) {
      _this->_impl_.optional_import_enum_ = from._impl_.optional_import_enum_;
    }
    if ((cached_has_bits & 0x02000000u) != 0) {
      _this->_impl_.optional_nested_enum_ = from._impl_.optional_nested_enum_;
    }
    if ((cached_has_bits & 0x04000000u) != 0) {
      _this->_impl_.optional_foreign_enum_ = from._impl_.optional_foreign_enum_;
    }
    if ((cached_has_bits & 0x08000000u) != 0) {
      _this->_internal_set_default_string(from._internal_default_string());
    }
    if ((cached_has_bits & 0x10000000u) != 0) {
      _this->_internal_set_default_bytes(from._internal_default_bytes());
    }
    if ((cached_has_bits & 0x20000000u) != 0) {
      _this->_internal_set_default_string_piece(from._internal_default_string_piece());
    }
    if ((cached_has_bits & 0x40000000u) != 0) {
      _this->_internal_set_default_cord(from._internal_default_cord());
    }
    if ((cached_has_bits & 0x80000000u) != 0) {
      _this->_internal_set_optional_bytes_cord(from._internal_optional_bytes_cord());
    }
  }
  cached_has_bits = from._impl_._has_bits_[1];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_impl_.default_int64_ = from._impl_.default_int64_;
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_impl_.default_int32_ = from._impl_.default_int32_;
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_impl_.default_uint32_ = from._impl_.default_uint32_;
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _this->_impl_.default_uint64_ = from._impl_.default_uint64_;
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      _this->_impl_.default_sint64_ = from._impl_.default_sint64_;
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      _this->_impl_.default_sint32_ = from._impl_.default_sint32_;
    }
    if ((cached_has_bits & 0x00000040u) != 0) {
      _this->_impl_.default_fixed32_ = from._impl_.default_fixed32_;
    }
    if ((cached_has_bits & 0x00000080u) != 0) {
      _this->_impl_.default_fixed64_ = from._impl_.default_fixed64_;
    }
  }
  if ((cached_has_bits & 0x0000ff00u) != 0) {
    if ((cached_has_bits & 0x00000100u) != 0) {
      _this->_impl_.default_sfixed64_ = from._impl_.default_sfixed64_;
    }
    if ((cached_has_bits & 0x00000200u) != 0) {
      _this->_impl_.default_sfixed32_ = from._impl_.default_sfixed32_;
    }
    if ((cached_has_bits & 0x00000400u) != 0) {
      _this->_impl_.default_float_ = from._impl_.default_float_;
    }
    if ((cached_has_bits & 0x00000800u) != 0) {
      _this->_impl_.default_double_ = from._impl_.default_double_;
    }
    if ((cached_has_bits & 0x00001000u) != 0) {
      _this->_impl_.default_bool_ = from._impl_.default_bool_;
    }
    if ((cached_has_bits & 0x00002000u) != 0) {
      _this->_impl_.default_nested_enum_ = from._impl_.default_nested_enum_;
    }
    if ((cached_has_bits & 0x00004000u) != 0) {
      _this->_impl_.default_foreign_enum_ = from._impl_.default_foreign_enum_;
    }
    if ((cached_has_bits & 0x00008000u) != 0) {
      _this->_impl_.default_import_enum_ = from._impl_.default_import_enum_;
    }
  }
  _this->_impl_._has_bits_.Or(from._impl_._has_bits_);
  if (const uint32_t oneof_from_case = from._impl_._oneof_case_[0]) {
    const uint32_t oneof_to_case = _this->_impl_._oneof_case_[0];
    const bool oneof_needs_init = oneof_to_case != oneof_from_case;
    if (oneof_needs_init) {
      if (oneof_to_case != 0) {
        _this->clear_oneof_field();
      }
      _this->_impl_._oneof_case_[0] = oneof_from_case;
    }

    switch (oneof_from_case) {
      case kOneofUint32: {
        _this->_impl_.oneof_field_.oneof_uint32_ = from._impl_.oneof_field_.oneof_uint32_;
        break;
      }
      case kOneofNestedMessage: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_nested_message_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.oneof_field_.oneof_nested_message_);
        } else {
          _this->_impl_.oneof_field_.oneof_nested_message_->MergeFrom(*from._impl_.oneof_field_.oneof_nested_message_);
        }
        break;
      }
      case kOneofString: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_string_.InitDefault();
        }
        _this->_impl_.oneof_field_.oneof_string_.Set(from._internal_oneof_string(), arena);
        break;
      }
      case kOneofBytes: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_bytes_.InitDefault();
        }
        _this->_impl_.oneof_field_.oneof_bytes_.Set(from._internal_oneof_bytes(), arena);
        break;
      }
      case kOneofCord: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_cord_.InitDefault();
        }
        _this->_impl_.oneof_field_.oneof_cord_.Set(from._internal_oneof_cord(), arena);
        break;
      }
      case kOneofStringPiece: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_string_piece_.InitDefault();
        }
        _this->_impl_.oneof_field_.oneof_string_piece_.Set(from._internal_oneof_string_piece(), arena);
        break;
      }
      case kOneofLazyNestedMessage: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_lazy_nested_message_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.oneof_field_.oneof_lazy_nested_message_);
        } else {
          _this->_impl_.oneof_field_.oneof_lazy_nested_message_->MergeFrom(*from._impl_.oneof_field_.oneof_lazy_nested_message_);
        }
        break;
      }
      case ONEOF_FIELD_NOT_SET:
        break;
    }
  }
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}